

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O1

locale __thiscall
booster::locale::impl_std::create_basic_formatting<char>
          (impl_std *this,locale *in,string *locale_name)

{
  time_put_from_base<char> *__f;
  locale base;
  locale local_20;
  locale local_18;
  
  create_basic_parsing<char>(this,in,locale_name);
  std::locale::locale(&local_20,(locale_name->_M_dataplus)._M_p);
  __f = (time_put_from_base<char> *)operator_new(0x18);
  *(undefined4 *)&__f->field_0x8 = 0;
  *(undefined ***)__f = &PTR__time_put_from_base_001d3090;
  std::locale::locale(&__f->base_,&local_20);
  std::locale::locale<booster::locale::impl_std::time_put_from_base<char>>
            (&local_18,(locale *)this,__f);
  std::locale::operator=((locale *)this,&local_18);
  std::locale::~locale(&local_18);
  std::locale::~locale(&local_20);
  return (locale)(_Impl *)this;
}

Assistant:

std::locale create_basic_formatting(std::locale const &in,std::string const &locale_name)
{
    std::locale tmp = create_basic_parsing<CharType>(in,locale_name);
    std::locale base(locale_name.c_str());
    tmp = std::locale(tmp,new time_put_from_base<CharType>(base));
    return tmp;
}